

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O1

void __thiscall polyscope::CurveNetwork::preparePick(CurveNetwork *this)

{
  ManagedBuffer<unsigned_int> *this_00;
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  undefined1 auVar6 [16];
  long *plVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  size_t iE;
  ulong uVar13;
  size_t i;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  pickColors;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  edgePickTip;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  edgePickEdge;
  allocator_type local_181;
  CurveNetwork *local_180;
  undefined1 local_178 [40];
  undefined1 local_150 [16];
  char local_140 [16];
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_130;
  element_type *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_100;
  double local_f8;
  double dStack_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this_00 = &this->edgeTailInds;
  render::ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(this_00);
  render::ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(&this->edgeTipInds);
  local_100 = (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
              &(this->super_QuantityStructure<polyscope::CurveNetwork>).field_0x428;
  sVar9 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size(local_100);
  sVar10 = render::ManagedBuffer<unsigned_int>::size(this_00);
  local_180 = this;
  sVar9 = pick::requestPickBufferRange((Structure *)this,sVar9 + sVar10);
  plVar7 = render::engine;
  local_178._0_8_ = (pointer)(local_178 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"RAYCAST_SPHERE","");
  local_150._0_8_ = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"SPHERE_PROPAGATE_COLOR","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_150;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c8,__l,&local_181);
  addCurveNetworkNodeRules
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_130,local_180,&local_c8);
  (**(code **)(*plVar7 + 0x158))(&local_118,plVar7,local_178,&local_130,2);
  p_Var8 = p_Stack_110;
  peVar5 = local_118;
  local_118 = (element_type *)0x0;
  p_Stack_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (local_180->nodePickProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (local_180->nodePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (local_180->nodePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var8;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  if ((char *)local_150._0_8_ != local_140) {
    operator_delete((void *)local_150._0_8_);
  }
  if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_);
  }
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  local_178._16_8_ = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  sVar10 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size(local_100);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::reserve((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)local_178,sVar10);
  local_f8 = 2.384185791015625e-07;
  dStack_f0 = 2.384185791015625e-07;
  sVar10 = sVar9;
  while( true ) {
    sVar11 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size(local_100);
    if (sVar11 + sVar9 <= sVar10) break;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = sVar10;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = sVar10 >> 0x16;
    auVar17 = vpunpcklqdq_avx(auVar20,auVar22);
    auVar6._8_8_ = 0x3fffff;
    auVar6._0_8_ = 0x3fffff;
    auVar17 = vpandq_avx512vl(auVar17,auVar6);
    auVar17 = vcvtqq2pd_avx512vl(auVar17);
    auVar21._0_8_ = auVar17._0_8_ * local_f8;
    auVar21._8_8_ = auVar17._8_8_ * dStack_f0;
    auVar17 = vcvtpd2ps_avx(auVar21);
    local_150._8_4_ = (undefined4)((double)(sVar10 >> 0x2c) * 2.384185791015625e-07);
    local_150._0_8_ = vmovlps_avx(auVar17);
    if (local_178._8_8_ == local_178._16_8_) {
      std::
      vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
      ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                  *)local_178,(iterator)local_178._8_8_,
                 (vec<3,_float,_(glm::qualifier)0> *)local_150);
    }
    else {
      ((anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(local_178._8_8_ + 8))->z =
           (float)local_150._8_4_;
      *(undefined8 *)local_178._8_8_ = local_150._0_8_;
      local_178._8_8_ = local_178._8_8_ + 0xc;
    }
    sVar10 = sVar10 + 1;
  }
  peVar5 = (local_180->nodePickProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"a_color","");
  (*peVar5->_vptr_ShaderProgram[0x15])(peVar5,local_50,local_178);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  fillNodeGeometryBuffers
            (local_180,
             (local_180->nodePickProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  if ((pointer)local_178._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_178._0_8_);
  }
  plVar7 = render::engine;
  local_178._0_8_ = (pointer)(local_178 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"RAYCAST_CYLINDER","");
  local_150._0_8_ = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"CYLINDER_PROPAGATE_PICK","");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_150;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0,__l_00,&local_181);
  addCurveNetworkEdgeRules
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_130,local_180,&local_e0);
  (**(code **)(*plVar7 + 0x158))(&local_118,plVar7,local_178,&local_130,2);
  p_Var8 = p_Stack_110;
  peVar5 = local_118;
  local_118 = (element_type *)0x0;
  p_Stack_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (local_180->edgePickProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (local_180->edgePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (local_180->edgePickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var8;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  if ((char *)local_150._0_8_ != local_140) {
    operator_delete((void *)local_150._0_8_);
  }
  if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_);
  }
  sVar10 = render::ManagedBuffer<unsigned_int>::size(this_00);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)local_178,sVar10,(allocator_type *)local_150);
  sVar10 = render::ManagedBuffer<unsigned_int>::size(this_00);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)local_150,sVar10,(allocator_type *)&local_130);
  sVar10 = render::ManagedBuffer<unsigned_int>::size(this_00);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(&local_130,sVar10,(allocator_type *)&local_118);
  lVar15 = 2;
  uVar13 = 0;
  while( true ) {
    sVar10 = render::ManagedBuffer<unsigned_int>::size(this_00);
    if (sVar10 <= uVar13) break;
    uVar2 = (((local_180->edgeTailInds).data)->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar13];
    uVar3 = (((local_180->edgeTipInds).data)->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar13];
    sVar10 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size(local_100);
    uVar16 = uVar3 + sVar9;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar16;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar16 >> 0x16;
    auVar17 = vpunpcklqdq_avx(auVar17,auVar19);
    auVar29._8_8_ = 0x3fffff;
    auVar29._0_8_ = 0x3fffff;
    auVar17 = vpand_avx(auVar17,auVar29);
    auVar17 = vcvtqq2pd_avx512vl(auVar17);
    auVar18._0_8_ = local_f8 * auVar17._0_8_;
    auVar18._8_8_ = dStack_f0 * auVar17._8_8_;
    auVar17 = vcvtpd2ps_avx(auVar18);
    uVar14 = uVar2 + sVar9;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar14;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar14 >> 0x16;
    auVar18 = vpunpcklqdq_avx(auVar23,auVar25);
    auVar18 = vpand_avx(auVar18,auVar29);
    auVar18 = vcvtqq2pd_avx512vl(auVar18);
    auVar24._0_8_ = local_f8 * auVar18._0_8_;
    auVar24._8_8_ = dStack_f0 * auVar18._8_8_;
    auVar18 = vcvtpd2ps_avx(auVar24);
    uVar12 = sVar10 + sVar9 + uVar13;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar12;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar12 >> 0x16;
    auVar19 = vpunpcklqdq_avx(auVar26,auVar28);
    auVar19 = vpand_avx(auVar19,auVar29);
    auVar19 = vcvtqq2pd_avx512vl(auVar19);
    auVar27._0_8_ = local_f8 * auVar19._0_8_;
    auVar27._8_8_ = dStack_f0 * auVar19._8_8_;
    auVar19 = vcvtpd2ps_avx(auVar27);
    uVar1 = vmovlps_avx(auVar18);
    *(undefined8 *)(local_178._0_8_ + lVar15 * 4 + -8) = uVar1;
    ((anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)local_178._0_8_)[lVar15].x =
         (float)((double)(uVar14 >> 0x2c) * 2.384185791015625e-07);
    uVar1 = vmovlps_avx(auVar17);
    *(undefined8 *)(local_150._0_8_ + lVar15 * 4 + -8) = uVar1;
    *(float *)(local_150._0_8_ + lVar15 * 4) =
         (float)((double)(uVar16 >> 0x2c) * 2.384185791015625e-07);
    uVar1 = vmovlps_avx(auVar19);
    *(undefined8 *)
     ((long)local_130.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar15 * 4 + -8) = uVar1;
    (&(local_130.
       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->field_0)[lVar15].x =
         (float)((double)(uVar12 >> 0x2c) * 2.384185791015625e-07);
    uVar13 = uVar13 + 1;
    lVar15 = lVar15 + 3;
  }
  peVar5 = (local_180->edgePickProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"a_color_tail","");
  (*peVar5->_vptr_ShaderProgram[0x15])(peVar5,local_70,local_178);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  peVar5 = (local_180->edgePickProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"a_color_tip","");
  (*peVar5->_vptr_ShaderProgram[0x15])(peVar5,local_90,local_150);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  peVar5 = (local_180->edgePickProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"a_color_edge","");
  (*peVar5->_vptr_ShaderProgram[0x15])(peVar5,local_b0,&local_130);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  fillEdgeGeometryBuffers
            (local_180,
             (local_180->edgePickProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  if (local_130.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char *)local_150._0_8_ != (char *)0x0) {
    operator_delete((void *)local_150._0_8_);
  }
  if ((pointer)local_178._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_178._0_8_);
  }
  return;
}

Assistant:

void CurveNetwork::preparePick() {
  edgeTailInds.ensureHostBufferPopulated();
  edgeTipInds.ensureHostBufferPopulated();

  // Pick index layout (local indices):
  //   |     --- nodes ---     |      --- edges ---      |
  //   ^                       ^
  //   0                    nNodes()

  // Request pick indices
  size_t totalPickElements = nNodes() + nEdges();
  size_t pickStart = pick::requestPickBufferRange(this, totalPickElements);

  { // Set up node picking program
    nodePickProgram =
        render::engine->requestShader("RAYCAST_SPHERE", addCurveNetworkNodeRules({"SPHERE_PROPAGATE_COLOR"}),
                                      render::ShaderReplacementDefaults::Pick);

    // Fill color buffer with packed point indices
    std::vector<glm::vec3> pickColors;
    pickColors.reserve(nNodes());
    for (size_t i = pickStart; i < pickStart + nNodes(); i++) {
      glm::vec3 val = pick::indToVec(i);
      pickColors.push_back(pick::indToVec(i));
    }

    // Store data in buffers
    nodePickProgram->setAttribute("a_color", pickColors);

    fillNodeGeometryBuffers(*nodePickProgram);
  }

  { // Set up edge picking program
    edgePickProgram =
        render::engine->requestShader("RAYCAST_CYLINDER", addCurveNetworkEdgeRules({"CYLINDER_PROPAGATE_PICK"}),
                                      render::ShaderReplacementDefaults::Pick);

    // Fill color buffer with packed node/edge indices
    std::vector<glm::vec3> edgePickTail(nEdges());
    std::vector<glm::vec3> edgePickTip(nEdges());
    std::vector<glm::vec3> edgePickEdge(nEdges());

    // Fill posiiton and pick index buffers
    for (size_t iE = 0; iE < nEdges(); iE++) {
      size_t eTail = edgeTailInds.data[iE];
      size_t eTip = edgeTipInds.data[iE];

      glm::vec3 colorValTail = pick::indToVec(pickStart + eTail);
      glm::vec3 colorValTip = pick::indToVec(pickStart + eTip);
      glm::vec3 colorValEdge = pick::indToVec(pickStart + nNodes() + iE);
      edgePickTail[iE] = colorValTail;
      edgePickTip[iE] = colorValTip;
      edgePickEdge[iE] = colorValEdge;
    }
    edgePickProgram->setAttribute("a_color_tail", edgePickTail);
    edgePickProgram->setAttribute("a_color_tip", edgePickTip);
    edgePickProgram->setAttribute("a_color_edge", edgePickEdge);

    fillEdgeGeometryBuffers(*edgePickProgram);
  }
}